

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O1

uint prvTidyNodeAttributeVersions(Node *node,TidyAttrId id)

{
  AttrVersion *pAVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar3 = 0;
  uVar4 = 0;
  if ((((node != (Node *)0x0) && (uVar4 = uVar3, node->tag != (Dict *)0x0)) &&
      (pAVar1 = node->tag->attrvers, pAVar1 != (AttrVersion *)0x0)) &&
     (pAVar1->attribute != TidyAttr_UNKNOWN)) {
    if (pAVar1->attribute == id) {
      uVar5 = 0;
    }
    else {
      uVar2 = 1;
      do {
        uVar5 = uVar2;
        if (pAVar1[uVar5].attribute == TidyAttr_UNKNOWN) {
          return 0;
        }
        uVar2 = (ulong)((int)uVar5 + 1);
      } while (pAVar1[uVar5].attribute != id);
    }
    uVar4 = pAVar1[uVar5].versions;
  }
  return uVar4;
}

Assistant:

uint TY_(NodeAttributeVersions)( Node* node, TidyAttrId id )
{
    uint i;

    if (!node || !node->tag || !node->tag->attrvers)
        return VERS_UNKNOWN;

    for (i = 0; node->tag->attrvers[i].attribute; ++i)
        if (node->tag->attrvers[i].attribute == id)
            return node->tag->attrvers[i].versions;

    return VERS_UNKNOWN;
}